

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>::detach_helper
          (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QRegularExpressionMatchIteratorPrivate *this_00;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate> *in_RDI;
  void *in_R8;
  QRegularExpressionMatchIteratorPrivate *x;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x15245b);
  Qt::totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>::operator->
            ((totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*> *)0x152465);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x15246d);
  if ((!bVar1) &&
     (this_00 = Qt::totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>::get
                          (&in_RDI->d), this_00 != (QRegularExpressionMatchIteratorPrivate *)0x0)) {
    QRegularExpressionMatchIteratorPrivate::~QRegularExpressionMatchIteratorPrivate(this_00);
    operator_delete(this_00,0x20);
  }
  Qt::totally_ordered_wrapper<QRegularExpressionMatchIteratorPrivate_*>::reset
            (&in_RDI->d,(QRegularExpressionMatchIteratorPrivate *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}